

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::JoinRef::Deserialize(JoinRef *this,Deserializer *deserializer)

{
  JoinRef *this_00;
  pointer pJVar1;
  _Head_base<0UL,_duckdb::JoinRef_*,_false> local_20;
  
  this_00 = (JoinRef *)operator_new(0xc0);
  JoinRef(this_00,REGULAR);
  local_20._M_head_impl = this_00;
  pJVar1 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>
            (deserializer,200,"left",&pJVar1->left);
  pJVar1 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>
            (deserializer,0xc9,"right",&pJVar1->right);
  pJVar1 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0xca,"condition",&pJVar1->condition);
  pJVar1 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_20);
  Deserializer::ReadProperty<duckdb::JoinType>(deserializer,0xcb,"join_type",&pJVar1->type);
  pJVar1 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_20);
  Deserializer::ReadProperty<duckdb::JoinRefType>(deserializer,0xcc,"ref_type",&pJVar1->ref_type);
  pJVar1 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xcd,"using_columns",&pJVar1->using_columns);
  pJVar1 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_20);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xce,"delim_flipped",&pJVar1->delim_flipped);
  pJVar1 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (deserializer,0xcf,"duplicate_eliminated_columns",&pJVar1->duplicate_eliminated_columns)
  ;
  (this->super_TableRef)._vptr_TableRef = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> JoinRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<JoinRef>(new JoinRef());
	deserializer.ReadPropertyWithDefault<unique_ptr<TableRef>>(200, "left", result->left);
	deserializer.ReadPropertyWithDefault<unique_ptr<TableRef>>(201, "right", result->right);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(202, "condition", result->condition);
	deserializer.ReadProperty<JoinType>(203, "join_type", result->type);
	deserializer.ReadProperty<JoinRefType>(204, "ref_type", result->ref_type);
	deserializer.ReadPropertyWithDefault<vector<string>>(205, "using_columns", result->using_columns);
	deserializer.ReadPropertyWithDefault<bool>(206, "delim_flipped", result->delim_flipped);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(207, "duplicate_eliminated_columns", result->duplicate_eliminated_columns);
	return std::move(result);
}